

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  conncache *connc;
  uint uVar1;
  uint uVar2;
  Curl_easy *pCVar3;
  Curl_easy *pCVar4;
  Curl_easy *pCVar5;
  connectdata *conn;
  CURLMcode CVar6;
  sigpipe_ignore pipe_st;
  sigpipe_ignore sStack_c8;
  
  CVar6 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    multi->type = 0;
    connc = &multi->conn_cache;
    conn = Curl_conncache_find_first_connection(connc);
    while (conn != (connectdata *)0x0) {
      pCVar3 = multi->closure_handle;
      conn->data = pCVar3;
      uVar1._0_1_ = (pCVar3->set).no_signal;
      uVar1._1_1_ = (pCVar3->set).global_dns_cache;
      uVar1._2_1_ = (pCVar3->set).tcp_nodelay;
      uVar1._3_1_ = (pCVar3->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar1,&sStack_c8);
      conn->data->easy_conn = (connectdata *)0x0;
      Curl_conncontrol(conn,1);
      Curl_disconnect(conn,false);
      if (sStack_c8.no_signal == false) {
        sigaction(0xd,(sigaction *)&sStack_c8,(sigaction *)0x0);
      }
      conn = Curl_conncache_find_first_connection(connc);
    }
    pCVar3 = multi->closure_handle;
    if (pCVar3 != (Curl_easy *)0x0) {
      uVar2._0_1_ = (pCVar3->set).no_signal;
      uVar2._1_1_ = (pCVar3->set).global_dns_cache;
      uVar2._2_1_ = (pCVar3->set).tcp_nodelay;
      uVar2._3_1_ = (pCVar3->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar2,&sStack_c8);
      pCVar4 = multi->closure_handle;
      (pCVar4->dns).hostcache = &multi->hostcache;
      Curl_hostcache_clean(pCVar4,&multi->hostcache);
      Curl_close(multi->closure_handle);
    }
    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(connc);
    Curl_llist_destroy(&multi->msglist,(void *)0x0);
    Curl_llist_destroy(&multi->pending,(void *)0x0);
    pCVar4 = multi->easyp;
    while (pCVar4 != (Curl_easy *)0x0) {
      pCVar5 = pCVar4->next;
      if ((pCVar4->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(pCVar4,(pCVar4->dns).hostcache);
        (pCVar4->dns).hostcache = (curl_hash *)0x0;
        (pCVar4->dns).hostcachetype = HCACHE_NONE;
      }
      (pCVar4->state).conn_cache = (conncache *)0x0;
      pCVar4->multi = (Curl_multi *)0x0;
      pCVar4 = pCVar5;
    }
    Curl_hash_destroy(&multi->hostcache);
    Curl_pipeline_set_site_blacklist((char **)0x0,&multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist((char **)0x0,&multi->pipelining_server_bl);
    (*Curl_cfree)(multi);
    CVar6 = CURLM_OK;
    if ((pCVar3 != (Curl_easy *)0x0) && (CVar6 = CURLM_OK, sStack_c8.no_signal == false)) {
      sigaction(0xd,(sigaction *)&sStack_c8,(sigaction *)0x0);
    }
  }
  return CVar6;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    bool restore_pipe = FALSE;
    SIGPIPE_VARIABLE(pipe_st);

    multi->type = 0; /* not good anymore */

    /* Close all the connections in the connection cache */
    close_all_connections(multi);

    if(multi->closure_handle) {
      sigpipe_ignore(multi->closure_handle, &pipe_st);
      restore_pipe = TRUE;

      multi->closure_handle->dns.hostcache = &multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,
                           multi->closure_handle->dns.hostcache);

      Curl_close(multi->closure_handle);
    }

    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist, NULL);
    Curl_llist_destroy(&multi->pending, NULL);

    /* remove all easy handles */
    data = multi->easyp;
    while(data) {
      nextdata=data->next;
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

      data = nextdata;
    }

    Curl_hash_destroy(&multi->hostcache);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);
    if(restore_pipe)
      sigpipe_restore(&pipe_st);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}